

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::configureNonLayeredFramebufferAttachment
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,GLuint texture_id,GLuint n_layer,
          bool should_use_as_color_attachment,bool should_update_draw_framebuffer)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  undefined4 local_20;
  GLenum framebuffer_target;
  GLenum attachment_type;
  bool should_update_draw_framebuffer_local;
  bool should_use_as_color_attachment_local;
  GLuint n_layer_local;
  GLuint texture_id_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (should_use_as_color_attachment) {
    local_20 = 0x8ce0;
  }
  else {
    local_20 = 0x8d00;
  }
  if (should_update_draw_framebuffer) {
    gl._4_4_ = 0x8ca9;
  }
  else {
    gl._4_4_ = 0x8ca8;
  }
  (**(code **)(lVar4 + 0x78))(gl._4_4_,this->m_framebuffer_object_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x120);
  (**(code **)(lVar4 + 0x6b8))(gl._4_4_,local_20,texture_id,0,n_layer);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glFramebufferTextureLayer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x124);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::configureNonLayeredFramebufferAttachment(
	glw::GLuint texture_id, glw::GLuint n_layer, bool should_use_as_color_attachment,
	bool should_update_draw_framebuffer)
{
	glw::GLenum			  attachment_type	= GL_NONE;
	glw::GLenum			  framebuffer_target = GL_NONE;
	const glw::Functions& gl				 = m_context.getRenderContext().getFunctions();

	/* Determine which attachment should be used */
	if (true == should_use_as_color_attachment)
	{
		attachment_type = GL_COLOR_ATTACHMENT0;
	}
	else
	{
		attachment_type = GL_DEPTH_ATTACHMENT;
	}

	/* Determine which framebuffer target should be used */
	if (true == should_update_draw_framebuffer)
	{
		framebuffer_target = GL_DRAW_FRAMEBUFFER;
	}
	else
	{
		framebuffer_target = GL_READ_FRAMEBUFFER;
	}

	/* Re-bind the framebuffer, just in case. */
	gl.bindFramebuffer(framebuffer_target, m_framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	/* Use the specified texture layer as attachment */
	gl.framebufferTextureLayer(framebuffer_target, attachment_type, texture_id, 0 /* level */, n_layer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");
}